

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adapter.cc
# Opt level: O0

bool __thiscall RaptorClientAdapter::Connect(RaptorClientAdapter *this,char *addr,size_t timeout_ms)

{
  bool bVar1;
  element_type *addr_00;
  Status *pSVar2;
  undefined8 uVar3;
  undefined8 in_R9;
  Status local_60;
  undefined1 local_30 [8];
  raptor_error e;
  size_t timeout_ms_local;
  char *addr_local;
  RaptorClientAdapter *this_local;
  
  e._value = (Status *)timeout_ms;
  addr_00 = std::__shared_ptr_access<raptor::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<raptor::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->_impl);
  raptor::TcpClient::Connect((TcpClient *)local_30,(char *)addr_00,(size_t)addr);
  bVar1 = raptor::RefCountedPtr<raptor::Status>::operator!=
                    ((RefCountedPtr<raptor::Status> *)local_30,(nullptr_t)0x0);
  if (bVar1) {
    pSVar2 = raptor::RefCountedPtr<raptor::Status>::operator->
                       ((RefCountedPtr<raptor::Status> *)local_30);
    raptor::Status::ToString_abi_cxx11_(&local_60);
    uVar3 = std::__cxx11::string::c_str();
    raptor::LogFormatPrint
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/surface/adapter.cc"
               ,0xa8,kLogLevelError,"server adapter: connect (%s)",uVar3,in_R9,pSVar2);
    std::__cxx11::string::~string((string *)&local_60);
  }
  this_local._7_1_ = !bVar1;
  raptor::RefCountedPtr<raptor::Status>::~RefCountedPtr((RefCountedPtr<raptor::Status> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool RaptorClientAdapter::Connect(const char* addr, size_t timeout_ms) {
    raptor_error e = _impl->Connect(addr, timeout_ms);
    if (e != RAPTOR_ERROR_NONE) {
        log_error("server adapter: connect (%s)", e->ToString().c_str());
        return false;
    }
    return true;
}